

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::DiffComplex<KVEntryUint32>::printJson
          (DiffComplex<KVEntryUint32> *this,size_t index,PrintIndent *out,int indent,char *space,
          char *nl)

{
  uint uVar1;
  undefined4 in_register_0000000c;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  string local_58;
  char *local_38;
  size_type sStack_30;
  ulong local_28;
  
  if (*(int *)((long)&this->values[index].super__Optional_base<KVEntryUint32,_false,_false>.
                      _M_payload.super__Optional_payload<KVEntryUint32,_true,_false,_false>.
                      super__Optional_payload_base<KVEntryUint32>._M_payload + 0x10) == 4) {
    uVar1 = **(uint **)((long)&this->values[index].super__Optional_base<KVEntryUint32,_false,_false>
                               ._M_payload.
                               super__Optional_payload<KVEntryUint32,_true,_false,_false>.
                               super__Optional_payload_base<KVEntryUint32>._M_payload._M_value.
                               super_KVEntry + 8);
    local_28 = (ulong)(uint)((out->indentBase + 3) * out->indentWidth);
    local_38 = "";
    format_str.size_ = 5;
    format_str.data_ = "{:{}}";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_38;
    args.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str,args);
    format_str_00.size_ = 2;
    format_str_00.data_ = "{}";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_38;
    args_00.desc_ = 2;
    local_38 = (char *)(ulong)uVar1;
    ::fmt::v10::vprint<char>(out->os,format_str_00,args_00);
  }
  else {
    KVEntry::extractRawBytes_abi_cxx11_
              (&local_58,(KVEntry *)(this->values + index),false,
               (char *)CONCAT44(in_register_0000000c,indent));
    local_28 = (ulong)(uint)((out->indentBase + 3) * out->indentWidth);
    local_38 = "";
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:{}}";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_38;
    args_01.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_01,args_01);
    local_38 = local_58._M_dataplus._M_p;
    sStack_30 = local_58._M_string_length;
    format_str_02.size_ = 2;
    format_str_02.data_ = "{}";
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_38;
    args_02.desc_ = 0xd;
    ::fmt::v10::vprint<char>(out->os,format_str_02,args_02);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printJson(std::size_t index, PrintIndent& out, int indent, const char* space, const char* nl) const {
        values[index]->printJson(out, indent, space, nl);
    }